

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O2

void jsoncons::detail::
     json_serialize_tuple_helper<2UL,_2UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
     ::encode(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *tuple,basic_json_visitor<char> *encoder,
             basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,error_code *ec)

{
  encode_traits<std::__cxx11::string,char,void>::
  encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (&(tuple->
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              ).
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl,encoder,proto,ec);
  if (ec->_M_value == 0) {
    encode_traits<int,char,void>::
    encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              ((int *)tuple,encoder,proto,ec);
    return;
  }
  return;
}

Assistant:

static void encode(const Tuple& tuple,
                               basic_json_visitor<char_type>& encoder, 
                               const Json& proto, 
                               std::error_code& ec)
            {
                encode_traits<element_type,char_type>::encode(std::get<Size-Pos>(tuple), encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                next::encode(tuple, encoder, proto, ec);
            }